

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QDockAreaLayoutItem>::reallocateAndGrow
          (QArrayDataPointer<QDockAreaLayoutItem> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QDockAreaLayoutItem> *old)

{
  QDockAreaLayoutItem *pQVar1;
  Data *pDVar2;
  QDockAreaLayoutItem *pQVar3;
  qsizetype qVar4;
  long lVar5;
  QDockAreaLayoutItem *pQVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QDockAreaLayoutItem> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar3 = local_48.ptr;
  if (this->size != 0) {
    lVar5 = this->size + (n >> 0x3f & n);
    if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QDockAreaLayoutItem> *)0x0)) ||
       (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      if ((lVar5 != 0) && (0 < lVar5)) {
        pQVar6 = this->ptr;
        pQVar1 = pQVar6 + lVar5;
        do {
          QDockAreaLayoutItem::QDockAreaLayoutItem(pQVar3 + local_48.size,pQVar6);
          pQVar6 = pQVar6 + 1;
          local_48.size = local_48.size + 1;
        } while (pQVar6 < pQVar1);
      }
    }
    else if ((lVar5 != 0) && (0 < lVar5)) {
      pQVar6 = this->ptr;
      pQVar1 = pQVar6 + lVar5;
      do {
        QDockAreaLayoutItem::QDockAreaLayoutItem(pQVar3 + local_48.size,pQVar6);
        pQVar6 = pQVar6 + 1;
        local_48.size = local_48.size + 1;
      } while (pQVar6 < pQVar1);
    }
  }
  pDVar2 = this->d;
  pQVar3 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar4 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar2;
  local_48.ptr = pQVar3;
  local_48.size = qVar4;
  if (old != (QArrayDataPointer<QDockAreaLayoutItem> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = pDVar2;
    old->ptr = pQVar3;
    local_48.size = old->size;
    old->size = qVar4;
  }
  ~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }